

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cc
# Opt level: O0

span<const_lf::mesh::Entity_*const,_18446744073709551615UL> __thiscall
lf::mesh::hybrid2d::Triangle::SubEntities(Triangle *this,uint rel_codim)

{
  const_pointer __first;
  const_pointer __first_00;
  runtime_error *this_00;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [380];
  uint local_24;
  anon_class_1_0_00000001 l;
  Triangle *pTStack_20;
  uint rel_codim_local;
  Triangle *this_local;
  
  local_24 = rel_codim;
  pTStack_20 = this;
  if (rel_codim == 0) {
    std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::
    span<lf::mesh::Entity_*const_*>
              ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&this_local,
               &this->this_,1);
  }
  else if (rel_codim == 1) {
    __first_00 = std::array<const_lf::mesh::hybrid2d::Segment_*,_3UL>::data(&this->edges_);
    std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::
    span<const_lf::mesh::Entity_*const_*>
              ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&this_local,
               (Entity **)__first_00,3);
  }
  else {
    if (rel_codim != 2) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::operator<<(local_1a0,"Triangle: rel_codim out of range");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"false",&local_1e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/triangle.cc"
                 ,&local_209);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_1e0,&local_208,0x5b,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator(&local_209);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"this code should not be reached");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __first = std::array<const_lf::mesh::hybrid2d::Point_*,_3UL>::data(&this->nodes_);
    std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::
    span<const_lf::mesh::Entity_*const_*>
              ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&this_local,
               (Entity **)__first,3);
  }
  return _this_local;
}

Assistant:

std::span<const Entity* const> Triangle::SubEntities(unsigned rel_codim) const {
  auto l = [&](auto i) -> const mesh::Entity& { return **i; };
  switch (rel_codim) {
    case 2:
      return {reinterpret_cast<const Entity* const*>(nodes_.data()), 3};
    case 1:
      return {reinterpret_cast<const Entity* const*>(edges_.data()), 3};
    case 0:
      return {&this_, 1};
    default:
      LF_VERIFY_MSG(false, "Triangle: rel_codim out of range");
  }
}